

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaLoader::FillMaterials(ColladaLoader *this,ColladaParser *pParser,aiScene *param_2)

{
  ai_real *pInput;
  float fVar1;
  Effect *effect;
  aiMaterial *this_00;
  ColladaParser *pParser_00;
  Logger *this_01;
  pair<Assimp::Collada::Effect_*,_aiMaterial_*> *elem;
  pointer ppVar2;
  int shadeMode;
  uint local_44;
  ColladaParser *local_40;
  pointer local_38;
  
  ppVar2 = (this->newMats).
           super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->newMats).
             super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = pParser;
  if (ppVar2 != local_38) {
    do {
      effect = ppVar2->first;
      this_00 = ppVar2->second;
      if (effect->mFaceted == true) {
        local_44 = 1;
      }
      else {
        switch(effect->mShadeType) {
        case Shade_Constant:
          local_44 = 9;
          break;
        case Shade_Phong:
          local_44 = 3;
          break;
        case Shade_Blinn:
          local_44 = 4;
          break;
        default:
          this_01 = DefaultLogger::get();
          Logger::warn(this_01,"Collada: Unrecognized shading mode, using gouraud shading");
        case Shade_Lambert:
          local_44 = 2;
        }
      }
      aiMaterial::AddBinaryProperty(this_00,&local_44,4,"$mat.shadingm",0,0,aiPTI_Integer);
      local_44 = (uint)effect->mDoubleSided;
      aiMaterial::AddBinaryProperty(this_00,&local_44,4,"$mat.twosided",0,0,aiPTI_Integer);
      local_44 = (uint)effect->mWireframe;
      aiMaterial::AddBinaryProperty(this_00,&local_44,4,"$mat.wireframe",0,0,aiPTI_Integer);
      aiMaterial::AddBinaryProperty(this_00,&effect->mAmbient,0x10,"$clr.ambient",0,0,aiPTI_Float);
      aiMaterial::AddBinaryProperty(this_00,&effect->mDiffuse,0x10,"$clr.diffuse",0,0,aiPTI_Float);
      aiMaterial::AddBinaryProperty(this_00,&effect->mSpecular,0x10,"$clr.specular",0,0,aiPTI_Float)
      ;
      aiMaterial::AddBinaryProperty(this_00,&effect->mEmissive,0x10,"$clr.emissive",0,0,aiPTI_Float)
      ;
      aiMaterial::AddBinaryProperty
                (this_00,&effect->mReflective,0x10,"$clr.reflective",0,0,aiPTI_Float);
      aiMaterial::AddBinaryProperty(this_00,&effect->mShininess,4,"$mat.shininess",0,0,aiPTI_Float);
      aiMaterial::AddBinaryProperty
                (this_00,&effect->mReflectivity,4,"$mat.reflectivity",0,0,aiPTI_Float);
      aiMaterial::AddBinaryProperty
                (this_00,&effect->mRefractIndex,4,"$mat.refracti",0,0,aiPTI_Float);
      pParser_00 = local_40;
      fVar1 = effect->mTransparency;
      if ((0.0 <= fVar1) && (fVar1 <= 1.0)) {
        if (effect->mRGBTransparency == true) {
          effect->mTransparency =
               fVar1 * ((effect->mTransparent).b * 0.072169 +
                       (effect->mTransparent).r * 0.212671 + (effect->mTransparent).g * 0.71516);
          (effect->mTransparent).a = 1.0;
          aiMaterial::AddBinaryProperty
                    (this_00,&effect->mTransparent,0x10,"$clr.transparent",0,0,aiPTI_Float);
        }
        else {
          effect->mTransparency = fVar1 * (effect->mTransparent).a;
        }
        pInput = &effect->mTransparency;
        if (effect->mInvertTransparency == true) {
          *pInput = 1.0 - *pInput;
        }
        if ((effect->mHasTransparency != false) || (*pInput <= 1.0 && *pInput != 1.0)) {
          aiMaterial::AddBinaryProperty(this_00,pInput,4,"$mat.opacity",0,0,aiPTI_Float);
        }
      }
      if ((effect->mTexAmbient).mName._M_string_length != 0) {
        AddTexture(this,this_00,pParser_00,effect,&effect->mTexAmbient,aiTextureType_LIGHTMAP,0);
      }
      if ((effect->mTexEmissive).mName._M_string_length != 0) {
        AddTexture(this,this_00,pParser_00,effect,&effect->mTexEmissive,aiTextureType_EMISSIVE,0);
      }
      if ((effect->mTexSpecular).mName._M_string_length != 0) {
        AddTexture(this,this_00,pParser_00,effect,&effect->mTexSpecular,aiTextureType_SPECULAR,0);
      }
      if ((effect->mTexDiffuse).mName._M_string_length != 0) {
        AddTexture(this,this_00,pParser_00,effect,&effect->mTexDiffuse,aiTextureType_DIFFUSE,0);
      }
      if ((effect->mTexBump).mName._M_string_length != 0) {
        AddTexture(this,this_00,pParser_00,effect,&effect->mTexBump,aiTextureType_NORMALS,0);
      }
      if ((effect->mTexTransparent).mName._M_string_length != 0) {
        AddTexture(this,this_00,pParser_00,effect,&effect->mTexTransparent,aiTextureType_OPACITY,0);
      }
      if ((effect->mTexReflective).mName._M_string_length != 0) {
        AddTexture(this,this_00,pParser_00,effect,&effect->mTexReflective,aiTextureType_REFLECTION,0
                  );
      }
      ppVar2 = ppVar2 + 1;
    } while (ppVar2 != local_38);
  }
  return;
}

Assistant:

void ColladaLoader::StoreAnimations(aiScene* pScene, const ColladaParser& pParser, const Collada::Animation* pSrcAnim, const std::string &pPrefix)
{
    std::string animName = pPrefix.empty() ? pSrcAnim->mName : pPrefix + "_" + pSrcAnim->mName;

    // create nested animations, if given
    for (std::vector<Collada::Animation*>::const_iterator it = pSrcAnim->mSubAnims.begin(); it != pSrcAnim->mSubAnims.end(); ++it)
        StoreAnimations(pScene, pParser, *it, animName);

    // create animation channels, if any
    if (!pSrcAnim->mChannels.empty())
        CreateAnimation(pScene, pParser, pSrcAnim, animName);
}